

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O0

int __thiscall QPDFNumberTreeObjectHelper::remove(QPDFNumberTreeObjectHelper *this,char *__filename)

{
  int iVar1;
  __shared_ptr_access<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  undefined8 extraout_RAX;
  QPDFObjectHandle local_30;
  QPDFObjectHandle *value_local;
  numtree_number key_local;
  QPDFNumberTreeObjectHelper *this_local;
  
  value_local = (QPDFObjectHandle *)__filename;
  key_local = (numtree_number)this;
  this_00 = (__shared_ptr_access<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            __shared_ptr_access<QPDFNumberTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFNumberTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m);
  this_01 = std::__shared_ptr_access<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->(this_00);
  QPDFObjectHandle::newInteger(&local_30,(longlong)value_local);
  iVar1 = NNTreeImpl::remove(this_01,(char *)&local_30);
  QPDFObjectHandle::~QPDFObjectHandle(&local_30);
  return (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),(char)iVar1) & 0xffffff01;
}

Assistant:

bool
QPDFNumberTreeObjectHelper::remove(numtree_number key, QPDFObjectHandle* value)
{
    return m->impl->remove(QPDFObjectHandle::newInteger(key), value);
}